

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

int __thiscall Widget_Browser::item_height(Widget_Browser *this,void *l)

{
  if (*(char *)((long)l + 0x43) == '\0') {
    return 0;
  }
  if ((show_comments != 0) && (*(long *)((long)l + 0x30) != 0)) {
    return (this->super_Fl_Browser_).textsize_ * 2 + 4;
  }
  return (this->super_Fl_Browser_).textsize_ + 5;
}

Assistant:

int Widget_Browser::item_height(void *l) const {
  Fl_Type *t = (Fl_Type*)l;
  if (t->visible) {
    if (show_comments && t->comment())
      return textsize()*2+4;
    else
      return textsize()+5;
  }
  return 0;
}